

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::AppendPartialToString(MessageLite *this,string *output)

{
  size_type sVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LogMessage *pLVar3;
  pointer pcVar4;
  pointer local_b0;
  EpsCopyOutputStream out;
  undefined1 local_60 [47];
  LogFinisher local_31;
  ulong value;
  
  sVar1 = output->_M_string_length;
  iVar2 = (*this->_vptr_MessageLite[9])();
  value = CONCAT44(extraout_var,iVar2);
  if ((value & 0xffffffff80000000) == 0) {
    std::__cxx11::string::resize((ulong)output,(char)iVar2 + (char)sVar1);
    pcVar4 = (output->_M_dataplus)._M_p + sVar1;
    out.stream_._2_1_ = io::CodedOutputStream::default_serialization_deterministic_ & 1;
    out.end_ = (uint8 *)0x0;
    out.buffer_[0x18] = '\0';
    out.buffer_[0x19] = '\0';
    out.buffer_[0x1a] = '\0';
    out.buffer_[0x1b] = '\0';
    out.buffer_[0x1c] = '\0';
    out.buffer_[0x1d] = '\0';
    out.buffer_[0x1e] = '\0';
    out.buffer_[0x1f] = '\0';
    out.stream_._0_2_ = 0;
    local_b0 = pcVar4 + value;
    iVar2 = (*this->_vptr_MessageLite[0xc])(this,pcVar4);
    if (pcVar4 + value == (pointer)CONCAT44(extraout_var_00,iVar2)) goto LAB_0023bb13;
    internal::LogMessage::LogMessage
              ((LogMessage *)&out.had_error_,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/message_lite.cc"
               ,0x168);
    pLVar3 = internal::LogMessage::operator<<
                       ((LogMessage *)&out.had_error_,"CHECK failed: target + size == res: ");
    internal::LogFinisher::operator=(&local_31,pLVar3);
    pLVar3 = (LogMessage *)&out.had_error_;
  }
  else {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_b0,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/message_lite.cc"
               ,0x1c9);
    (*this->_vptr_MessageLite[2])(&out.had_error_,this);
    pLVar3 = internal::LogMessage::operator<<((LogMessage *)&local_b0,(string *)&out.had_error_);
    pLVar3 = internal::LogMessage::operator<<(pLVar3," exceeded maximum protobuf size of 2GB: ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,value);
    internal::LogFinisher::operator=(&local_31,pLVar3);
    if ((undefined1 *)out._56_8_ != local_60) {
      operator_delete((void *)out._56_8_);
    }
    pLVar3 = (LogMessage *)&local_b0;
  }
  internal::LogMessage::~LogMessage(pLVar3);
LAB_0023bb13:
  return value >> 0x1f == 0;
}

Assistant:

bool MessageLite::AppendPartialToString(std::string* output) const {
  size_t old_size = output->size();
  size_t byte_size = ByteSizeLong();
  if (byte_size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << byte_size;
    return false;
  }

  STLStringResizeUninitialized(output, old_size + byte_size);
  uint8* start =
      reinterpret_cast<uint8*>(io::mutable_string_data(output) + old_size);
  SerializeToArrayImpl(*this, start, byte_size);
  return true;
}